

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

Curl_addrinfo * Curl_doh(Curl_easy *data,char *hostname,int port,int *waitp)

{
  undefined1 *puVar1;
  connectdata *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  dohdata *pdVar5;
  curl_slist *headers;
  long lVar6;
  
  pcVar2 = data->conn;
  *waitp = 0;
  pdVar5 = (dohdata *)(*Curl_ccalloc)(1,0x488);
  (data->req).doh = pdVar5;
  if (pdVar5 == (dohdata *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  puVar1 = &(pcVar2->bits).field_0x3;
  *puVar1 = *puVar1 | 4;
  pdVar5->host = hostname;
  pdVar5->port = port;
  headers = curl_slist_append((curl_slist *)0x0,"Content-Type: application/dns-message");
  pdVar5->headers = headers;
  if ((headers != (curl_slist *)0x0) &&
     (CVar4 = dohprobe(data,pdVar5->probe,DNS_TYPE_A,hostname,(data->set).str[0x43],data->multi,
                       headers), CVar4 == CURLE_OK)) {
    pdVar5->pending = pdVar5->pending + 1;
    if ((pcVar2->ip_version != '\x01') && (_Var3 = Curl_ipv6works(data), _Var3)) {
      CVar4 = dohprobe(data,pdVar5->probe + 1,DNS_TYPE_AAAA,hostname,(data->set).str[0x43],
                       data->multi,pdVar5->headers);
      if (CVar4 != CURLE_OK) goto LAB_00589e4c;
      pdVar5->pending = pdVar5->pending + 1;
    }
    *waitp = 1;
    return (Curl_addrinfo *)0x0;
  }
LAB_00589e4c:
  curl_slist_free_all(pdVar5->headers);
  ((data->req).doh)->headers = (curl_slist *)0x0;
  for (lVar6 = 8; lVar6 != 0x478; lVar6 = lVar6 + 0x238) {
    curl_multi_remove_handle
              (data->multi,*(Curl_easy **)(pdVar5->probe[0].dohbuffer + lVar6 + -0x14));
    Curl_close((Curl_easy **)(pdVar5->probe[0].dohbuffer + lVar6 + -0x14));
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_doh(struct Curl_easy *data,
                               const char *hostname,
                               int port,
                               int *waitp)
{
  CURLcode result = CURLE_OK;
  int slot;
  struct dohdata *dohp;
  struct connectdata *conn = data->conn;
  *waitp = FALSE;
  (void)hostname;
  (void)port;

  DEBUGASSERT(!data->req.doh);
  DEBUGASSERT(conn);

  /* start clean, consider allocating this struct on demand */
  dohp = data->req.doh = calloc(1, sizeof(struct dohdata));
  if(!dohp)
    return NULL;

  conn->bits.doh = TRUE;
  dohp->host = hostname;
  dohp->port = port;
  dohp->headers =
    curl_slist_append(NULL,
                      "Content-Type: application/dns-message");
  if(!dohp->headers)
    goto error;

  /* create IPv4 DoH request */
  result = dohprobe(data, &dohp->probe[DOH_PROBE_SLOT_IPADDR_V4],
                    DNS_TYPE_A, hostname, data->set.str[STRING_DOH],
                    data->multi, dohp->headers);
  if(result)
    goto error;
  dohp->pending++;

#ifdef ENABLE_IPV6
  if((conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* create IPv6 DoH request */
    result = dohprobe(data, &dohp->probe[DOH_PROBE_SLOT_IPADDR_V6],
                      DNS_TYPE_AAAA, hostname, data->set.str[STRING_DOH],
                      data->multi, dohp->headers);
    if(result)
      goto error;
    dohp->pending++;
  }
#endif
  *waitp = TRUE; /* this never returns synchronously */
  return NULL;

error:
  curl_slist_free_all(dohp->headers);
  data->req.doh->headers = NULL;
  for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
    (void)curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
    Curl_close(&dohp->probe[slot].easy);
  }
  Curl_safefree(data->req.doh);
  return NULL;
}